

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

short duckdb::VectorTryCastOperator<duckdb::NumericTryCast>::Operation<double,short>
                (double input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  short unaff_BP;
  duckdb *this;
  double dVar2;
  string local_48;
  
  this = (duckdb *)idx;
  bVar1 = Value::IsFinite<double>(input);
  if (bVar1) {
    bVar1 = false;
    if ((-32768.0 <= input) && (bVar1 = false, input < 32768.0)) {
      dVar2 = nearbyint(input);
      unaff_BP = (short)(int)dVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  if (!bVar1) {
    CastExceptionText<double,short>(&local_48,this,input);
    unaff_BP = HandleVectorCastError::Operation<short>
                         (&local_48,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return unaff_BP;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		RESULT_TYPE output;
		if (DUCKDB_LIKELY(OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, output))) {
			return output;
		}
		auto data = reinterpret_cast<VectorTryCastData *>(dataptr);
		return HandleVectorCastError::Operation<RESULT_TYPE>(CastExceptionText<INPUT_TYPE, RESULT_TYPE>(input), mask,
		                                                     idx, *data);
	}